

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void * ym3812_init(UINT32 clock,UINT32 rate)

{
  FM_OPL *pFVar1;
  
  pFVar1 = OPLCreate(clock,rate,1);
  if (pFVar1 != (FM_OPL *)0x0) {
    pFVar1->UpdateHandler = ym3812_update_req;
    pFVar1->UpdateParam = pFVar1;
  }
  return pFVar1;
}

Assistant:

void * ym3812_init(UINT32 clock, UINT32 rate)
{
	/* emulator create */
	FM_OPL *YM3812 = OPLCreate(clock,rate,OPL_TYPE_YM3812);
	if (YM3812 == NULL)
		return NULL;
	
	OPLSetUpdateHandler(YM3812, ym3812_update_req, YM3812);
	//ym3812_reset_chip(YM3812);
	return YM3812;
}